

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O3

qtmsg * construct_qtlist(long hdr_offset)

{
  int iVar1;
  qtmsg *ptr;
  int n_msgs;
  int local_1c;
  
  dlb_fseek(msg_file,hdr_offset,0);
  Fread(&local_1c,4,1,msg_file);
  iVar1 = local_1c;
  ptr = (qtmsg *)malloc((ulong)(local_1c + 1) * 0x18);
  Fread(ptr,iVar1 * 0x18,1,msg_file);
  ptr[local_1c].msgnum = -1;
  return ptr;
}

Assistant:

static struct qtmsg *construct_qtlist(long hdr_offset)
{
	struct qtmsg *msg_list;
	int	n_msgs;

	dlb_fseek(msg_file, hdr_offset, SEEK_SET);
	Fread(&n_msgs, sizeof(int), 1, msg_file);
	msg_list = malloc((unsigned)(n_msgs+1)*sizeof(struct qtmsg));

	/*
	 * Load up the list.
	 */
	Fread(msg_list, n_msgs*sizeof(struct qtmsg), 1, msg_file);

	msg_list[n_msgs].msgnum = -1;
	return msg_list;
}